

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O3

void __thiscall TSMuxer::writeEmptyPacketWithPCRTest(TSMuxer *this,int64_t pcrVal)

{
  pointer puVar1;
  uint8_t *puVar2;
  uint uVar3;
  uint8_t *puVar4;
  int iVar5;
  uint32_t uVar6;
  mapped_type *pmVar7;
  ulong uVar8;
  char cVar9;
  long lVar10;
  
  iVar5 = this->m_outBufLen;
  if (this->m_m2tsMode == true) {
    iVar5 = iVar5 + 4;
    this->m_outBufLen = iVar5;
    this->m_processedBlockSize = this->m_processedBlockSize + 4;
    this->m_pcrBits = this->m_pcrBits + 0x20;
  }
  puVar4 = this->m_outBuf;
  lVar10 = (long)iVar5;
  puVar2 = puVar4 + lVar10;
  puVar2[0] = 'G';
  puVar2[1] = '\0';
  puVar2[2] = '\0';
  puVar2[3] = '\0';
  puVar2[4] = '\a';
  puVar2[5] = '\x10';
  puVar2[6] = '\0';
  puVar2[7] = '\0';
  uVar3 = (this->m_pmt).pcr_pid;
  *(uint *)(puVar4 + lVar10) = (uVar3 & 0x1f00) + (uVar3 & 0xff) * 0x10000 + 0x20000047;
  uVar6 = my_ntohl((uint32_t)((ulong)pcrVal >> 1));
  *(uint32_t *)(puVar4 + lVar10 + 6) = uVar6;
  puVar4[lVar10 + 10] = (char)pcrVal << 7 | 0x7e;
  puVar4[lVar10 + 0xb] = '\0';
  pmVar7 = std::
           map<int,_TSMuxer::StreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TSMuxer::StreamInfo>_>_>
           ::operator[](&this->m_streamInfo,&(this->m_pmt).pcr_pid);
  uVar3 = *(uint *)(puVar4 + lVar10);
  *(uint *)(puVar4 + lVar10) = uVar3 & 0xf0ffffff | (pmVar7->m_tsCnt & 0xfU) << 0x18;
  uVar8 = 4;
  if ((uVar3 >> 0x1d & 1) != 0) {
    uVar8 = (ulong)(puVar4[lVar10 + 4] + 5);
  }
  memset(puVar4 + uVar8 + lVar10,0xff,(long)(0xbc - (int)uVar8));
  cVar9 = -4;
  if ((*(uint *)(puVar4 + lVar10) >> 0x1d & 1) != 0) {
    cVar9 = -5 - (char)*(undefined4 *)(puVar4 + lVar10 + 4);
  }
  puVar4[lVar10 + 4] = cVar9 + (char)*(undefined4 *)(puVar4 + lVar10 + 4) + 0xbc;
  this->m_outBufLen = this->m_outBufLen + 0xbc;
  this->m_processedBlockSize = this->m_processedBlockSize + 0xbc;
  this->m_pcrBits = this->m_pcrBits + 0x5e0;
  puVar1 = (this->m_muxedPacketCnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish + -1;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void TSMuxer::writeEmptyPacketWithPCRTest(const int64_t pcrVal)
{
    if (m_m2tsMode)
    {
        m_outBufLen += 4;
        m_processedBlockSize += 4;
        m_pcrBits += 4 * 8;
    }
    uint8_t* curBuf = m_outBuf + m_outBufLen;
    const auto tsPacket = reinterpret_cast<TSPacket*>(curBuf);
    const auto initTS = reinterpret_cast<uint32_t*>(curBuf);
    *initTS = TSPacket::TS_FRAME_SYNC_BYTE;
    initTS[1] = 0x07 + TSPacket::PCR_BIT_VAL;
    tsPacket->setPID(m_pmt.pcr_pid);
    tsPacket->afExists = 1;
    tsPacket->adaptiveField.setPCR33(pcrVal);
    tsPacket->counter = m_streamInfo[m_pmt.pcr_pid].m_tsCnt;  // do not increment counter because data_exists == 0

    memset(curBuf + tsPacket->getHeaderSize(), 0xff, TS_FRAME_SIZE - tsPacket->getHeaderSize());
    tsPacket->adaptiveField.length += TS_FRAME_SIZE - tsPacket->getHeaderSize();
    m_outBufLen += TS_FRAME_SIZE;
    m_processedBlockSize += TS_FRAME_SIZE;
    m_pcrBits += TS_FRAME_SIZE * 8;
    m_muxedPacketCnt[m_muxedPacketCnt.size() - 1]++;
}